

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int32_t zng_deflateGetParams(zng_stream *strm,zng_deflate_param_value *params,size_t count)

{
  zng_deflate_param zVar1;
  internal_state *piVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  int32_t *piVar6;
  int32_t iVar7;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  
  piVar6 = &params->status;
  sVar8 = count;
  while (bVar9 = sVar8 != 0, sVar8 = sVar8 - 1, bVar9) {
    *piVar6 = 0;
    piVar6 = piVar6 + 8;
  }
  iVar4 = deflateStateCheck(strm);
  if (iVar4 == 0) {
    piVar2 = strm->state;
    piVar6 = &params->status;
    bVar9 = false;
    bVar3 = false;
    while( true ) {
      bVar10 = count == 0;
      count = count - 1;
      if (bVar10) break;
      zVar1 = ((zng_deflate_param_value *)(piVar6 + -6))->param;
      if (zVar1 == Z_DEFLATE_REPRODUCIBLE) {
        if (3 < *(ulong *)(piVar6 + -2)) {
          iVar4 = piVar2->reproducible;
          goto LAB_001054d1;
        }
LAB_001054ba:
        *piVar6 = -5;
      }
      else {
        if (zVar1 == Z_DEFLATE_STRATEGY) {
          if (*(ulong *)(piVar6 + -2) < 4) goto LAB_001054ba;
          iVar4 = piVar2->strategy;
        }
        else {
          if (zVar1 != Z_DEFLATE_LEVEL) {
            *piVar6 = -6;
            bVar3 = true;
            goto LAB_001054d8;
          }
          if (*(ulong *)(piVar6 + -2) < 4) goto LAB_001054ba;
          iVar4 = piVar2->level;
        }
LAB_001054d1:
        **(int **)(piVar6 + -4) = iVar4;
      }
LAB_001054d8:
      if (*piVar6 == -5) {
        bVar9 = true;
      }
      piVar6 = piVar6 + 8;
    }
    iVar7 = -6;
    if (!bVar3) {
      iVar7 = 0;
    }
    iVar5 = -5;
    if (!bVar9) {
      iVar5 = iVar7;
    }
  }
  else {
    iVar5 = -2;
  }
  return iVar5;
}

Assistant:

int32_t Z_EXPORT zng_deflateGetParams(zng_stream *strm, zng_deflate_param_value *params, size_t count) {
    deflate_state *s;
    size_t i;
    int32_t buf_error = 0;
    int32_t version_error = 0;

    /* Initialize the statuses. */
    for (i = 0; i < count; i++)
        params[i].status = Z_OK;

    /* Check whether the stream state is consistent. */
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    for (i = 0; i < count; i++) {
        switch (params[i].param) {
            case Z_DEFLATE_LEVEL:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->level;
                break;
            case Z_DEFLATE_STRATEGY:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->strategy;
                break;
            case Z_DEFLATE_REPRODUCIBLE:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->reproducible;
                break;
            default:
                params[i].status = Z_VERSION_ERROR;
                version_error = 1;
                break;
        }
        if (params[i].status == Z_BUF_ERROR)
            buf_error = 1;
    }
    return buf_error ? Z_BUF_ERROR : (version_error ? Z_VERSION_ERROR : Z_OK);
}